

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O3

int __thiscall
cmExtraCodeBlocksGenerator::GetCBTargetType
          (cmExtraCodeBlocksGenerator *this,cmGeneratorTarget *target)

{
  bool bVar1;
  TargetType TVar2;
  uint uVar3;
  string local_60;
  string local_40;
  
  TVar2 = cmGeneratorTarget::GetType(target);
  if (TVar2 == EXECUTABLE) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"WIN32_EXECUTABLE","");
    bVar1 = cmGeneratorTarget::GetPropertyAsBool(target,&local_40);
    uVar3 = 0;
    if (!bVar1) {
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"MACOSX_BUNDLE","");
      bVar1 = cmGeneratorTarget::GetPropertyAsBool(target,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      uVar3 = (uint)!bVar1;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    TVar2 = cmGeneratorTarget::GetType(target);
    uVar3 = 2;
    if (TVar2 != STATIC_LIBRARY) {
      TVar2 = cmGeneratorTarget::GetType(target);
      if (TVar2 != OBJECT_LIBRARY) {
        TVar2 = cmGeneratorTarget::GetType(target);
        uVar3 = 3;
        if (TVar2 != SHARED_LIBRARY) {
          TVar2 = cmGeneratorTarget::GetType(target);
          uVar3 = (TVar2 != MODULE_LIBRARY) + 3;
        }
      }
    }
  }
  return uVar3;
}

Assistant:

int cmExtraCodeBlocksGenerator::GetCBTargetType(cmGeneratorTarget* target)
{
  if ( target->GetType()==cmState::EXECUTABLE)
    {
    if ((target->GetPropertyAsBool("WIN32_EXECUTABLE"))
        || (target->GetPropertyAsBool("MACOSX_BUNDLE")))
      {
      return 0;
      }
    else
      {
      return 1;
      }
    }
  else if (( target->GetType()==cmState::STATIC_LIBRARY)
        || (target->GetType()==cmState::OBJECT_LIBRARY))
    {
    return 2;
    }
  else if ((target->GetType()==cmState::SHARED_LIBRARY)
           || (target->GetType()==cmState::MODULE_LIBRARY))
    {
    return 3;
    }
  return 4;
}